

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O3

ostream * __thiscall
serialize::write<std::__cxx11::string,std::__cxx11::string>
          (serialize *this,ostream *ostream_,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *container)

{
  _Rb_tree_node_base *p_Var1;
  size_t in_RCX;
  size_t __n;
  size_t __n_00;
  long lVar2;
  bool bVar3;
  undefined1 local_78 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p;
  uint32_t size;
  
  p.second.field_2._12_4_ = *(undefined4 *)(ostream_ + 0x28);
  if (LE()::le == '\0') {
    write<std::__cxx11::string,std::__cxx11::string>(this,(int)ostream_,container,in_RCX);
  }
  if (LE()::le == '\0') {
    lVar2 = 3;
    do {
      std::ostream::write((char *)this,(long)&p.second.field_2 + lVar2 + 0xc);
      bVar3 = lVar2 != 0;
      lVar2 = lVar2 + -1;
    } while (bVar3);
  }
  else {
    std::ostream::write((char *)this,(long)((long)&p.second.field_2 + 0xc));
  }
  p_Var1 = *(_Rb_tree_node_base **)(ostream_ + 0x18);
  if (p_Var1 != (_Rb_tree_node_base *)(ostream_ + 8)) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_78,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(p_Var1 + 1));
      write((int)this,
            (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_78,__n);
      write((int)this,(void *)((long)&p.first.field_2 + 8),__n_00);
      if ((size_type *)p.first.field_2._8_8_ != &p.second._M_string_length) {
        operator_delete((void *)p.first.field_2._8_8_);
      }
      if (local_78 != (undefined1  [8])&p.first._M_string_length) {
        operator_delete((void *)local_78);
      }
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while (p_Var1 != (_Rb_tree_node_base *)(ostream_ + 8));
  }
  return (ostream *)this;
}

Assistant:

static inline ostream&  write(ostream& ostream_, map<K, V>& container)
{

	uint32_t size = container.size();
	write(ostream_, size);

	for (auto p : container)
	{
		write(ostream_, p.first);
		write(ostream_, p.second);


	}
	return ostream_;
}